

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall leveldb::VersionSet::Builder::Apply(Builder *this,VersionEdit *edit)

{
  int iVar1;
  pointer ppVar2;
  pointer ppVar3;
  int iVar4;
  _Base_ptr p_Var5;
  FileMetaData *this_00;
  size_t i;
  ulong uVar6;
  long lVar7;
  Slice local_60;
  uint64_t number;
  
  lVar7 = 8;
  uVar6 = 0;
  while( true ) {
    ppVar2 = (edit->compact_pointers_).
             super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(edit->compact_pointers_).
                       super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2) / 0x28) <= uVar6)
    break;
    iVar1 = *(int *)((long)ppVar2 + lVar7 + -8);
    local_60 = InternalKey::Encode((InternalKey *)((long)&ppVar2->first + lVar7));
    Slice::ToString_abi_cxx11_((string *)&number,&local_60);
    std::__cxx11::string::operator=
              ((string *)(this->vset_->compact_pointer_ + iVar1),(string *)&number);
    std::__cxx11::string::~string((string *)&number);
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x28;
  }
  for (p_Var5 = (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    number = (uint64_t)p_Var5[1]._M_parent;
    std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::_M_insert_unique<unsigned_long_const&>
              ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                *)(this->levels_ + (int)p_Var5[1]._M_color),&number);
  }
  lVar7 = 8;
  uVar6 = 0;
  while( true ) {
    ppVar3 = (edit->new_files_).
             super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(edit->new_files_).
                       super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3) / 0x60) <= uVar6)
    break;
    iVar1 = *(int *)((long)ppVar3 + lVar7 + -8);
    this_00 = (FileMetaData *)operator_new(0x58);
    FileMetaData::FileMetaData(this_00,(FileMetaData *)((long)&ppVar3->first + lVar7));
    this_00->refs = 1;
    iVar4 = (int)(this_00->file_size >> 0xe);
    if (iVar4 < 0x65) {
      iVar4 = 100;
    }
    this_00->allowed_seeks = iVar4;
    number = (uint64_t)this_00;
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::erase((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
             *)(this->levels_ + iVar1),&this_00->number);
    std::
    _Rb_tree<leveldb::FileMetaData*,leveldb::FileMetaData*,std::_Identity<leveldb::FileMetaData*>,leveldb::VersionSet::Builder::BySmallestKey,std::allocator<leveldb::FileMetaData*>>
    ::_M_insert_unique<leveldb::FileMetaData*const&>
              ((_Rb_tree<leveldb::FileMetaData*,leveldb::FileMetaData*,std::_Identity<leveldb::FileMetaData*>,leveldb::VersionSet::Builder::BySmallestKey,std::allocator<leveldb::FileMetaData*>>
                *)this->levels_[iVar1].added_files,(FileMetaData **)&number);
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x60;
  }
  return;
}

Assistant:

void Apply(VersionEdit* edit) {
    // Update compaction pointers
    for (size_t i = 0; i < edit->compact_pointers_.size(); i++) {
      const int level = edit->compact_pointers_[i].first;
      vset_->compact_pointer_[level] =
          edit->compact_pointers_[i].second.Encode().ToString();
    }

    // Delete files
    for (const auto& deleted_file_set_kvp : edit->deleted_files_) {
      const int level = deleted_file_set_kvp.first;
      const uint64_t number = deleted_file_set_kvp.second;
      levels_[level].deleted_files.insert(number);
    }

    // Add new files
    for (size_t i = 0; i < edit->new_files_.size(); i++) {
      const int level = edit->new_files_[i].first;
      FileMetaData* f = new FileMetaData(edit->new_files_[i].second);
      f->refs = 1;

      // We arrange to automatically compact this file after
      // a certain number of seeks.  Let's assume:
      //   (1) One seek costs 10ms
      //   (2) Writing or reading 1MB costs 10ms (100MB/s)
      //   (3) A compaction of 1MB does 25MB of IO:
      //         1MB read from this level
      //         10-12MB read from next level (boundaries may be misaligned)
      //         10-12MB written to next level
      // This implies that 25 seeks cost the same as the compaction
      // of 1MB of data.  I.e., one seek costs approximately the
      // same as the compaction of 40KB of data.  We are a little
      // conservative and allow approximately one seek for every 16KB
      // of data before triggering a compaction.
      f->allowed_seeks = static_cast<int>((f->file_size / 16384U));
      if (f->allowed_seeks < 100) f->allowed_seeks = 100;

      levels_[level].deleted_files.erase(f->number);
      levels_[level].added_files->insert(f);
    }
  }